

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int test_constRef(void)

{
  T3_A *pTVar1;
  uint uVar2;
  int iVar3;
  Context ctx;
  string local_78;
  Context local_58;
  
  di::Context::Context(&local_58);
  pTVar1 = di::Context::get<T3_A>(&local_58);
  T3_A::run_abi_cxx11_(&local_78,pTVar1);
  uVar2 = (byte)*local_78._M_dataplus._M_p - 0x41;
  if ((uVar2 == 0) && (uVar2 = (byte)local_78._M_dataplus._M_p[1] - 0x42, uVar2 == 0)) {
    uVar2 = (uint)(byte)local_78._M_dataplus._M_p[2];
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (uVar2 == 0) {
    iVar3 = 1;
  }
  else {
    pTVar1 = di::Context::get<T3_A>(&local_58);
    T3_A::run_abi_cxx11_(&local_78,pTVar1);
    iVar3 = 0;
    printf("%s:%d expected \"%s\", actual: \"%s\"\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/hoditohod[P]di-light/test.cpp",
           0xf3,"AB",local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  di::Context::~Context(&local_58);
  return iVar3;
}

Assistant:

int test_constRef()
{
    di::Context ctx;
    TINYTEST_STR_EQUAL( "AB", ctx.get<T3_A>().run().c_str() );
    return 1;
}